

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264_stream.c
# Opt level: O2

void read_dec_ref_base_pic_marking(nal_t *nal,bs_t *b)

{
  prefix_nal_svc_t *ppVar1;
  uint32_t uVar2;
  uint uVar3;
  
  uVar2 = bs_read_u1(b);
  nal->prefix_nal_svc->adaptive_ref_base_pic_marking_mode_flag = SUB41(uVar2,0);
  uVar3 = uVar2 & 1;
  while (uVar3 != 0) {
    uVar3 = bs_read_ue(b);
    nal->prefix_nal_svc->memory_management_base_control_operation = uVar3;
    if (uVar3 == 1) {
      uVar2 = bs_read_ue(b);
      ppVar1 = nal->prefix_nal_svc;
      ppVar1->difference_of_base_pic_nums_minus1 = uVar2;
      uVar3 = ppVar1->memory_management_base_control_operation;
    }
    if (uVar3 == 2) {
      uVar2 = bs_read_ue(b);
      ppVar1 = nal->prefix_nal_svc;
      ppVar1->long_term_base_pic_num = uVar2;
      uVar3 = ppVar1->memory_management_base_control_operation;
    }
  }
  return;
}

Assistant:

void read_dec_ref_base_pic_marking(nal_t* nal, bs_t* b)
{
    nal->prefix_nal_svc->adaptive_ref_base_pic_marking_mode_flag = bs_read_u1(b);
    if( nal->prefix_nal_svc->adaptive_ref_base_pic_marking_mode_flag )
    {
        do {
            nal->prefix_nal_svc->memory_management_base_control_operation = bs_read_ue(b);
            
            if( nal->prefix_nal_svc->memory_management_base_control_operation == 1 )
            {
                nal->prefix_nal_svc->difference_of_base_pic_nums_minus1 = bs_read_ue(b);
            }
            if( nal->prefix_nal_svc->memory_management_base_control_operation == 2 )
            {
                nal->prefix_nal_svc->long_term_base_pic_num = bs_read_ue(b);
            }
        } while( nal->prefix_nal_svc->memory_management_base_control_operation != 0 );
    }
}